

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyGraph.cpp
# Opt level: O2

History * pgi::get_history(History *__return_storage_ptr__,path_t *p,PolicyGraph *g)

{
  pointer peVar1;
  edge_desc_impl<boost::bidirectional_tag,_unsigned_long> *e;
  pointer peVar2;
  ActionObservation local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>::reserve
            (__return_storage_ptr__,
             ((long)(p->
                    super__Vector_base<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(p->
                   super__Vector_base<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  peVar1 = (p->
           super__Vector_base<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (peVar2 = (p->
                super__Vector_base<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start; peVar2 != peVar1; peVar2 = peVar2 + 1) {
    local_38.action_index_ =
         (g->super_type).m_vertices.
         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>::config::stored_vertex>_>
         ._M_impl.super__Vector_impl_data._M_start
         [(peVar2->super_edge_base<boost::bidirectional_tag,_unsigned_long>).m_source].
         super_StoredVertex.m_property;
    local_38.observation_index_ = *peVar2->m_eproperty;
    std::vector<pgi::ActionObservation,_std::allocator<pgi::ActionObservation>_>::
    emplace_back<pgi::ActionObservation>(__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

History get_history(const path_t& p, const PolicyGraph& g) {
  History h;
  h.reserve(p.size());
  for (const auto& e : p) {
    h.emplace_back(ActionObservation{g[boost::source(e, g)], g[e]});
  }
  return h;
}